

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DuckSchemaEntry::DuckSchemaEntry
          (DuckSchemaEntry *this,Catalog *catalog,CreateSchemaInfo *info)

{
  DefaultGenerator *local_a0;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_98;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_90;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_88;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_80;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_78;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_70;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_68;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_60;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_58;
  CatalogSet *local_50;
  CatalogSet *local_48;
  CatalogSet *local_40;
  CatalogSet *local_38;
  
  SchemaCatalogEntry::SchemaCatalogEntry(&this->super_SchemaCatalogEntry,catalog,info);
  (this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__DuckSchemaEntry_027a1be0;
  make_uniq<duckdb::DefaultViewGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            ((duckdb *)&local_a0,catalog,this);
  local_58._M_head_impl = local_a0;
  local_a0 = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->tables,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_58);
  if (local_58._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_58._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_58._M_head_impl = (DefaultGenerator *)0x0;
  if (local_a0 != (DefaultGenerator *)0x0) {
    (*local_a0->_vptr_DefaultGenerator[1])();
  }
  local_60._M_head_impl = (DefaultGenerator *)0x0;
  local_38 = &this->tables;
  CatalogSet::CatalogSet
            (&this->indexes,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_60);
  if (local_60._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_60._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_60._M_head_impl = (DefaultGenerator *)0x0;
  local_40 = &this->indexes;
  make_uniq<duckdb::DefaultTableFunctionGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            ((duckdb *)&local_a0,catalog,this);
  local_68._M_head_impl = local_a0;
  local_a0 = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->table_functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_68);
  if (local_68._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_68._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_68._M_head_impl = (DefaultGenerator *)0x0;
  if (local_a0 != (DefaultGenerator *)0x0) {
    (*local_a0->_vptr_DefaultGenerator[1])();
  }
  local_70._M_head_impl = (DefaultGenerator *)0x0;
  local_48 = &this->table_functions;
  CatalogSet::CatalogSet
            (&this->copy_functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_70);
  if (local_70._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_70._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_70._M_head_impl = (DefaultGenerator *)0x0;
  local_78._M_head_impl = (DefaultGenerator *)0x0;
  local_50 = &this->copy_functions;
  CatalogSet::CatalogSet
            (&this->pragma_functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_78);
  if (local_78._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_78._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_78._M_head_impl = (DefaultGenerator *)0x0;
  make_uniq<duckdb::DefaultFunctionGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            ((duckdb *)&local_a0,catalog,this);
  local_80._M_head_impl = local_a0;
  local_a0 = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_80);
  if (local_80._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_80._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_80._M_head_impl = (DefaultGenerator *)0x0;
  if (local_a0 != (DefaultGenerator *)0x0) {
    (*local_a0->_vptr_DefaultGenerator[1])();
  }
  local_88._M_head_impl = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->sequences,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_88);
  if (local_88._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_88._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_88._M_head_impl = (DefaultGenerator *)0x0;
  local_90._M_head_impl = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->collations,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_90);
  if (local_90._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_90._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_90._M_head_impl = (DefaultGenerator *)0x0;
  make_uniq<duckdb::DefaultTypeGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            ((duckdb *)&local_a0,catalog,this);
  local_98._M_head_impl = local_a0;
  local_a0 = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->types,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_98);
  if (local_98._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_98._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_98._M_head_impl = (DefaultGenerator *)0x0;
  if (local_a0 != (DefaultGenerator *)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  return;
}

Assistant:

DuckSchemaEntry::DuckSchemaEntry(Catalog &catalog, CreateSchemaInfo &info)
    : SchemaCatalogEntry(catalog, info), tables(catalog, make_uniq<DefaultViewGenerator>(catalog, *this)),
      indexes(catalog), table_functions(catalog, make_uniq<DefaultTableFunctionGenerator>(catalog, *this)),
      copy_functions(catalog), pragma_functions(catalog),
      functions(catalog, make_uniq<DefaultFunctionGenerator>(catalog, *this)), sequences(catalog), collations(catalog),
      types(catalog, make_uniq<DefaultTypeGenerator>(catalog, *this)) {
}